

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this;
  char *pcVar4;
  LinkClosure *pLVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  cmComputeLinkInformation *cli;
  cmLinkLineComputer *this_00;
  cmLinkLineDeviceComputer deviceLinkComputer;
  string cuda_lang;
  cmLinkLineComputer cStack_c8;
  cmStateDirectory local_88;
  string local_60 [32];
  cmStateSnapshot local_40;
  
  this_00 = &cStack_c8;
  this = cmGeneratorTarget::GetGlobalGenerator(target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cStack_c8,"CUDA",(allocator<char> *)&local_88);
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this,(string *)&cStack_c8);
  std::__cxx11::string::~string((string *)&cStack_c8);
  if (bVar1) {
    TVar3 = cmGeneratorTarget::GetType(target);
    if (TVar3 != OBJECT_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cStack_c8,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&local_88);
      pcVar4 = cmGeneratorTarget::GetProperty(target,(string *)&cStack_c8);
      std::__cxx11::string::~string((string *)&cStack_c8);
      if (pcVar4 != (char *)0x0) {
        bVar2 = cmSystemTools::IsOn(pcVar4);
        goto LAB_00268f93;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cStack_c8,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&local_88);
      pcVar4 = cmGeneratorTarget::GetProperty(target,(string *)&cStack_c8);
      std::__cxx11::string::~string((string *)&cStack_c8);
      if (pcVar4 != (char *)0x0) {
        bVar1 = cmSystemTools::IsOn(pcVar4);
        if (bVar1) {
          TVar3 = cmGeneratorTarget::GetType(target);
          if (TVar3 < OBJECT_LIBRARY) {
            bVar2 = 0xd >> ((byte)TVar3 & 0xf);
            goto LAB_00268f93;
          }
          goto LAB_00268f91;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"CUDA",(allocator<char> *)&cStack_c8);
      pLVar5 = cmGeneratorTarget::GetLinkClosure(target,config);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pLVar5->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pLVar5->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_60);
      if (_Var6._M_current ==
          (pLVar5->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = false;
      }
      else {
        cli = cmGeneratorTarget::GetLinkInformation(target,config);
        if (cli == (cmComputeLinkInformation *)0x0) {
          bVar2 = true;
        }
        else {
          cmLocalGenerator::GetStateSnapshot(&local_40,lg);
          cmStateSnapshot::GetDirectory(&local_88,&local_40);
          cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                    ((cmLinkLineDeviceComputer *)&cStack_c8,&lg->super_cmOutputConverter,&local_88);
          bVar2 = cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                            ((cmLinkLineDeviceComputer *)this_00,cli);
          cmLinkLineComputer::~cmLinkLineComputer(&cStack_c8);
        }
      }
      std::__cxx11::string::~string(local_60);
      goto LAB_00268f93;
    }
  }
LAB_00268f91:
  bVar2 = 0;
LAB_00268f93:
  return (bool)(bVar2 & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (const char* resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmSystemTools::IsOn(resolveDeviceSymbols);
  }

  if (const char* separableCompilation =
        target.GetProperty("CUDA_SEPARABLE_COMPILATION")) {
    if (cmSystemTools::IsOn(separableCompilation)) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  bool closureHasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());
  if (closureHasCUDA) {
    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}